

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

htsFile * hts_hopen(hFILE *hfile,char *fn,char *mode)

{
  uint uVar1;
  int iVar2;
  htsFormatCategory hVar3;
  htsFile *__ptr;
  char *pcVar4;
  BGZF *pBVar5;
  SAM_hdr *pSVar6;
  cram_fd *pcVar7;
  htsCompression hVar8;
  htsExactFormat hVar9;
  
  __ptr = (htsFile *)calloc(1,0x60);
  if (__ptr == (htsFile *)0x0) goto LAB_0010daa9;
  pcVar4 = strdup(fn);
  __ptr->fn = pcVar4;
  pcVar4 = strchr(mode,0x72);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = strchr(mode,0x77);
    if ((pcVar4 == (char *)0x0) && (pcVar4 = strchr(mode,0x61), pcVar4 == (char *)0x0))
    goto LAB_0010daa9;
    *(uint *)__ptr = 2;
    pcVar4 = strchr(mode,0x62);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = strchr(mode,99);
      if (pcVar4 == (char *)0x0) {
        (__ptr->format).format = text_format;
        hVar9 = text_format;
      }
      else {
        (__ptr->format).format = cram;
        hVar9 = cram;
      }
    }
    else {
      (__ptr->format).format = binary_format;
      hVar9 = binary_format;
    }
    pcVar4 = strchr(mode,0x7a);
    hVar8 = bgzf;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = strchr(mode,0x67);
      hVar8 = gzip;
      if (pcVar4 != (char *)0x0) goto LAB_0010d98c;
      pcVar4 = strchr(mode,0x75);
      hVar8 = no_compression;
      if (pcVar4 != (char *)0x0) goto LAB_0010d98c;
      if (hVar9 == binary_format) {
        hVar8 = bgzf;
LAB_0010db3b:
        (__ptr->format).compression = hVar8;
        hVar3 = unknown_category;
      }
      else {
        if (hVar9 == text_format) {
          hVar8 = no_compression;
          goto LAB_0010db3b;
        }
        if (hVar9 != cram) {
          abort();
        }
        (__ptr->format).compression = custom;
        hVar3 = sequence_data;
      }
    }
    else {
LAB_0010d98c:
      (__ptr->format).compression = hVar8;
      hVar3 = unknown_category;
      if (hVar9 - sam < 4) {
        hVar3 = *(htsFormatCategory *)(&DAT_001560d0 + (ulong)(hVar9 - sam) * 4);
      }
    }
    (__ptr->format).category = hVar3;
    (__ptr->format).version.major = -1;
    (__ptr->format).version.minor = -1;
    (__ptr->format).compression_level = -1;
    (__ptr->format).specific = (void *)0x0;
  }
  else {
    iVar2 = hts_detect_format(hfile,&__ptr->format);
    if (iVar2 < 0) goto LAB_0010daa9;
    hVar9 = (__ptr->format).format;
  }
  if (hVar9 < csi) {
    if ((0x10cU >> (hVar9 & 0x1f) & 1) == 0) {
      if ((0x212U >> (hVar9 & 0x1f) & 1) == 0) {
        if (hVar9 == cram) {
          pcVar7 = cram_dopen(hfile,fn,mode);
          (__ptr->fp).cram = pcVar7;
          if (pcVar7 != (cram_fd *)0x0) {
            uVar1 = *(uint *)__ptr;
            if ((uVar1 & 2) == 0) {
              cram_set_option(pcVar7,CRAM_OPT_DECODE_MD,1);
            }
            *(uint *)__ptr = uVar1 | 8;
            return __ptr;
          }
        }
      }
      else {
        pBVar5 = bgzf_hopen(hfile,mode);
        (__ptr->fp).bgzf = pBVar5;
        if (pBVar5 != (BGZF *)0x0) {
          *(byte *)__ptr = *(byte *)__ptr | 1;
          return __ptr;
        }
      }
    }
    else if ((undefined1  [96])((undefined1  [96])*__ptr & (undefined1  [96])0x2) ==
             (undefined1  [96])0x0) {
      pSVar6 = (SAM_hdr *)bgzf_hopen(hfile,mode);
      if (pSVar6 != (SAM_hdr *)0x0) {
        pcVar7 = (cram_fd *)calloc(1,0x28);
        pcVar7->header = pSVar6;
        pcVar7->mode = 0x40000;
        pcVar4 = (char *)malloc(0x10000);
        pcVar7->prefix = pcVar4;
        (__ptr->fp).cram = pcVar7;
        return __ptr;
      }
    }
    else {
      if ((__ptr->format).compression == no_compression) {
        (__ptr->fp).hfile = hfile;
        return __ptr;
      }
      pBVar5 = bgzf_hopen(hfile,mode);
      (__ptr->fp).bgzf = pBVar5;
      if (pBVar5 != (BGZF *)0x0) {
        return __ptr;
      }
    }
  }
LAB_0010daa9:
  if (1 < hts_verbose) {
    fprintf(_stderr,"[E::%s] fail to open file \'%s\'\n","hts_hopen",fn);
  }
  if (__ptr != (htsFile *)0x0) {
    free(__ptr->fn);
    free(__ptr->fn_aux);
    free(__ptr);
  }
  return (htsFile *)0x0;
}

Assistant:

htsFile *hts_hopen(struct hFILE *hfile, const char *fn, const char *mode)
{
    htsFile *fp = (htsFile*)calloc(1, sizeof(htsFile));
    if (fp == NULL) goto error;

    fp->fn = strdup(fn);
    fp->is_be = ed_is_big();

    if (strchr(mode, 'r')) {
        if (hts_detect_format(hfile, &fp->format) < 0) goto error;
    }
    else if (strchr(mode, 'w') || strchr(mode, 'a')) {
        htsFormat *fmt = &fp->format;
        fp->is_write = 1;

        if (strchr(mode, 'b')) fmt->format = binary_format;
        else if (strchr(mode, 'c')) fmt->format = cram;
        else fmt->format = text_format;

        if (strchr(mode, 'z')) fmt->compression = bgzf;
        else if (strchr(mode, 'g')) fmt->compression = gzip;
        else if (strchr(mode, 'u')) fmt->compression = no_compression;
        else {
            // No compression mode specified, set to the default for the format
            switch (fmt->format) {
            case binary_format: fmt->compression = bgzf; break;
            case cram: fmt->compression = custom; break;
            case text_format: fmt->compression = no_compression; break;
            default: abort();
            }
        }

        // Fill in category (if determinable; e.g. 'b' could be BAM or BCF)
        fmt->category = format_category(fmt->format);

        fmt->version.major = fmt->version.minor = -1;
        fmt->compression_level = -1;
        fmt->specific = NULL;
    }
    else goto error;

    switch (fp->format.format) {
    case binary_format:
    case bam:
    case bcf:
        fp->fp.bgzf = bgzf_hopen(hfile, mode);
        if (fp->fp.bgzf == NULL) goto error;
        fp->is_bin = 1;
        break;

    case cram:
        fp->fp.cram = cram_dopen(hfile, fn, mode);
        if (fp->fp.cram == NULL) goto error;
        if (!fp->is_write)
            cram_set_option(fp->fp.cram, CRAM_OPT_DECODE_MD, 1);
        fp->is_cram = 1;
        break;

    case text_format:
    case sam:
    case vcf:
        if (!fp->is_write) {
        #if KS_BGZF
            BGZF *gzfp = bgzf_hopen(hfile, mode);
        #else
            // TODO Implement gzip hFILE adaptor
            hclose(hfile); // This won't work, especially for stdin
            gzFile gzfp = strcmp(fn, "-")? gzopen(fn, "rb") : gzdopen(fileno(stdin), "rb");
        #endif
            if (gzfp) fp->fp.voidp = ks_init(gzfp);
            else goto error;
        }
        else if (fp->format.compression != no_compression) {
            fp->fp.bgzf = bgzf_hopen(hfile, mode);
            if (fp->fp.bgzf == NULL) goto error;
        }
        else
            fp->fp.hfile = hfile;
        break;

    default:
        goto error;
    }

    return fp;

error:
    if (hts_verbose >= 2)
        fprintf(stderr, "[E::%s] fail to open file '%s'\n", __func__, fn);

    if (fp) {
        free(fp->fn);
        free(fp->fn_aux);
        free(fp);
    }
    return NULL;
}